

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cpp
# Opt level: O2

void __thiscall
CRollingBloomFilter::insert(CRollingBloomFilter *this,Span<const_unsigned_char> vKey)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  ulong uVar4;
  uint uVar5;
  uint32_t uVar6;
  int iVar7;
  int n;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar7 = this->nEntriesThisGeneration;
  if (iVar7 == this->nEntriesPerGeneration) {
    uVar5 = this->nGeneration + 1;
    uVar8 = 1;
    if (uVar5 != 4) {
      uVar8 = uVar5;
    }
    this->nGeneration = uVar8;
    puVar2 = (this->data).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar3 = (this->data).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar7 = 0;
    for (uVar10 = 0; uVar9 = uVar10 & 0xffffffff, uVar9 < (ulong)((long)puVar2 - (long)puVar3 >> 3);
        uVar10 = uVar10 + 2) {
      uVar4 = puVar3[uVar10 + 1];
      uVar11 = uVar4 ^ (long)-((int)uVar8 >> 1) | puVar3[uVar9] ^ -(ulong)(uVar8 & 1);
      puVar3[uVar9] = puVar3[uVar9] & uVar11;
      puVar3[uVar10 + 1] = uVar11 & uVar4;
    }
  }
  this->nEntriesThisGeneration = iVar7 + 1;
  for (uVar8 = 0; (int)uVar8 < this->nHashFuncs; uVar8 = uVar8 + 1) {
    uVar6 = RollingBloomHash(uVar8,this->nTweak,vKey);
    puVar2 = (this->data).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = ((ulong)((long)(this->data).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) >> 3 &
             0xffffffff) * (ulong)uVar6 >> 0x1d;
    uVar9 = uVar10 & 0xfffffffffffffff0;
    uVar5 = this->nGeneration;
    *(ulong *)((long)puVar2 + uVar9) =
         (ulong)(uVar5 & 1) << ((byte)uVar6 & 0x3f) |
         *(ulong *)((long)puVar2 + uVar9) & ~(1L << ((ulong)uVar6 & 0x3f));
    uVar10 = uVar10 & 0xfffffffffffffff8 | 8;
    *(ulong *)((long)puVar2 + uVar10) =
         (long)((int)uVar5 >> 1) << ((byte)uVar6 & 0x3f) |
         *(ulong *)((long)puVar2 + uVar10) & ~(1L << ((ulong)uVar6 & 0x3f));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CRollingBloomFilter::insert(Span<const unsigned char> vKey)
{
    if (nEntriesThisGeneration == nEntriesPerGeneration) {
        nEntriesThisGeneration = 0;
        nGeneration++;
        if (nGeneration == 4) {
            nGeneration = 1;
        }
        uint64_t nGenerationMask1 = 0 - (uint64_t)(nGeneration & 1);
        uint64_t nGenerationMask2 = 0 - (uint64_t)(nGeneration >> 1);
        /* Wipe old entries that used this generation number. */
        for (uint32_t p = 0; p < data.size(); p += 2) {
            uint64_t p1 = data[p], p2 = data[p + 1];
            uint64_t mask = (p1 ^ nGenerationMask1) | (p2 ^ nGenerationMask2);
            data[p] = p1 & mask;
            data[p + 1] = p2 & mask;
        }
    }
    nEntriesThisGeneration++;

    for (int n = 0; n < nHashFuncs; n++) {
        uint32_t h = RollingBloomHash(n, nTweak, vKey);
        int bit = h & 0x3F;
        /* FastMod works with the upper bits of h, so it is safe to ignore that the lower bits of h are already used for bit. */
        uint32_t pos = FastRange32(h, data.size());
        /* The lowest bit of pos is ignored, and set to zero for the first bit, and to one for the second. */
        data[pos & ~1U] = (data[pos & ~1U] & ~(uint64_t{1} << bit)) | (uint64_t(nGeneration & 1)) << bit;
        data[pos | 1] = (data[pos | 1] & ~(uint64_t{1} << bit)) | (uint64_t(nGeneration >> 1)) << bit;
    }
}